

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O1

void dotty(lua_State *L)

{
  long lVar1;
  int iVar2;
  int status;
  char *pcVar3;
  size_t size;
  char *pcVar4;
  size_t local_40;
  char *local_38;
  
  local_38 = progname;
  progname = (char *)0x0;
  do {
    lua_settop(L,0);
    iVar2 = pushline(L,1);
    status = -1;
    if (iVar2 != 0) {
      while( true ) {
        pcVar3 = lua_tolstring(L,1,(size_t *)0x0);
        size = lua_objlen(L,1);
        status = luaL_loadbuffer(L,pcVar3,size,"=stdin");
        if (status != 3) break;
        pcVar3 = lua_tolstring(L,-1,&local_40);
        lVar1 = local_40 - 7;
        pcVar4 = strstr(pcVar3,"\'<eof>\'");
        if (pcVar4 != pcVar3 + lVar1) break;
        lua_settop(L,-2);
        iVar2 = pushline(L,0);
        if (iVar2 == 0) {
          status = -1;
          goto LAB_0010a514;
        }
        lua_pushlstring(L,"\n",1);
        lua_insert(L,-2);
        lua_concat(L,3);
      }
      lua_remove(L,1);
    }
LAB_0010a514:
    if (status == 0) {
      status = docall(L,0,0);
    }
    else if (status == -1) {
      lua_settop(L,0);
      fputs("\n",_stdout);
      fflush(_stdout);
      progname = local_38;
      return;
    }
    report(L,status);
    if (status == 0) {
      iVar2 = lua_gettop(L);
      if (0 < iVar2) {
        lua_getfield(L,-0x2712,"print");
        lua_insert(L,1);
        iVar2 = lua_gettop(L);
        iVar2 = lua_pcall(L,iVar2 + -1,0,0);
        if (iVar2 != 0) {
          dotty_cold_1();
        }
      }
    }
  } while( true );
}

Assistant:

static void dotty(lua_State *L)
{
  int status;
  const char *oldprogname = progname;
  progname = NULL;
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK) status = docall(L, 0, 0);
    report(L, status);
    if (status == LUA_OK && lua_gettop(L) > 0) {  /* any result to print? */
      lua_getglobal(L, "print");
      lua_insert(L, 1);
      if (lua_pcall(L, lua_gettop(L)-1, 0, 0) != 0)
	l_message(progname,
	  lua_pushfstring(L, "error calling " LUA_QL("print") " (%s)",
			      lua_tostring(L, -1)));
    }
  }
  lua_settop(L, 0);  /* clear stack */
  fputs("\n", stdout);
  fflush(stdout);
  progname = oldprogname;
}